

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

void __thiscall
Json::BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine
          (BuiltStyledStreamWriter *this,Value *root)

{
  bool bVar1;
  Value *in_RSI;
  long in_RDI;
  BuiltStyledStreamWriter *in_stack_ffffffffffffff60;
  string *psVar2;
  ostream *poVar3;
  string local_80 [20];
  CommentPlacement in_stack_ffffffffffffff94;
  Value *in_stack_ffffffffffffff98;
  string local_50 [32];
  string local_30 [32];
  Value *local_10;
  
  if (*(int *)(in_RDI + 0x70) != 0) {
    local_10 = in_RSI;
    bVar1 = Value::hasComment(in_RSI,commentAfterOnSameLine);
    if (bVar1) {
      poVar3 = *(ostream **)(in_RDI + 8);
      Value::getComment_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      std::operator+((char *)poVar3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_ffffffffffffff60);
      std::operator<<(poVar3,local_30);
      std::__cxx11::string::~string(local_30);
      std::__cxx11::string::~string(local_50);
    }
    bVar1 = Value::hasComment(local_10,commentAfter);
    if (bVar1) {
      writeIndent(in_stack_ffffffffffffff60);
      poVar3 = *(ostream **)(in_RDI + 8);
      psVar2 = local_80;
      Value::getComment_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      std::operator<<(poVar3,psVar2);
      std::__cxx11::string::~string(local_80);
    }
  }
  return;
}

Assistant:

void BuiltStyledStreamWriter::writeCommentAfterValueOnSameLine(Value const& root) {
  if (cs_ == CommentStyle::None) return;
  if (root.hasComment(commentAfterOnSameLine))
    *sout_ << " " + root.getComment(commentAfterOnSameLine);

  if (root.hasComment(commentAfter)) {
    writeIndent();
    *sout_ << root.getComment(commentAfter);
  }
}